

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_icc.c
# Opt level: O3

int jas_iccattrtab_resize(jas_iccattrtab_t *tab,int maxents)

{
  int iVar1;
  jas_iccattr_t *pjVar2;
  
  if (tab->numattrs <= maxents) {
    if (tab->attrs == (jas_iccattr_t *)0x0) {
      pjVar2 = (jas_iccattr_t *)jas_alloc2((ulong)(uint)maxents,0x10);
    }
    else {
      pjVar2 = (jas_iccattr_t *)jas_realloc2(tab->attrs,(ulong)(uint)maxents,0x10);
    }
    if (pjVar2 == (jas_iccattr_t *)0x0) {
      iVar1 = -1;
    }
    else {
      tab->attrs = pjVar2;
      tab->maxattrs = maxents;
      iVar1 = 0;
    }
    return iVar1;
  }
  __assert_fail("maxents >= tab->numattrs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/base/jas_icc.c"
                ,0x2e8,"int jas_iccattrtab_resize(jas_iccattrtab_t *, int)");
}

Assistant:

static int jas_iccattrtab_resize(jas_iccattrtab_t *tab, int maxents)
{
	jas_iccattr_t *newattrs;
	assert(maxents >= tab->numattrs);
	newattrs = tab->attrs ? jas_realloc2(tab->attrs, maxents,
	  sizeof(jas_iccattr_t)) : jas_alloc2(maxents, sizeof(jas_iccattr_t));
	if (!newattrs) {
		return -1;
	}
	tab->attrs = newattrs;
	tab->maxattrs = maxents;
	return 0;
}